

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmEmitInstr(jx9_vm *pVm,sxi32 iOp,sxi32 iP1,sxu32 iP2,void *p3,sxu32 *pIndex)

{
  sxi32 sVar1;
  undefined1 local_48 [4];
  sxi32 rc;
  VmInstr sInstr;
  sxu32 *pIndex_local;
  void *p3_local;
  sxu32 iP2_local;
  sxi32 iP1_local;
  sxi32 iOp_local;
  jx9_vm *pVm_local;
  
  local_48[0] = (undefined1)iOp;
  if (pIndex != (sxu32 *)0x0) {
    *pIndex = pVm->pByteContainer->nUsed;
  }
  rc = iP1;
  sInstr._0_4_ = iP2;
  sInstr._8_8_ = p3;
  sInstr.p3 = pIndex;
  sVar1 = SySetPut(pVm->pByteContainer,local_48);
  if (sVar1 != 0) {
    jx9GenCompileError(&pVm->sCodeGen,1,1,"Fatal, Cannot emit instruction due to a memory failure");
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmEmitInstr(
	jx9_vm *pVm,  /* Target VM */
	sxi32 iOp,    /* Operation to perform */
	sxi32 iP1,    /* First operand */
	sxu32 iP2,    /* Second operand */
	void *p3,     /* Third operand */
	sxu32 *pIndex /* Instruction index. NULL otherwise */
	)
{
	VmInstr sInstr;
	sxi32 rc;
	/* Fill the VM instruction */
	sInstr.iOp = (sxu8)iOp; 
	sInstr.iP1 = iP1; 
	sInstr.iP2 = iP2; 
	sInstr.p3  = p3;  
	if( pIndex ){
		/* Instruction index in the bytecode array */
		*pIndex = SySetUsed(pVm->pByteContainer);
	}
	/* Finally, record the instruction */
	rc = SySetPut(pVm->pByteContainer, (const void *)&sInstr);
	if( rc != SXRET_OK ){
		jx9GenCompileError(&pVm->sCodeGen, E_ERROR, 1, "Fatal, Cannot emit instruction due to a memory failure");
		/* Fall throw */
	}
	return rc;
}